

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZMatrix<Fad<long_double>_>_> * __thiscall
TPZAutoPointer<TPZMatrix<Fad<long_double>_>_>::operator=
          (TPZAutoPointer<TPZMatrix<Fad<long_double>_>_> *this,
          TPZAutoPointer<TPZMatrix<Fad<long_double>_>_> *rval)

{
  bool bVar1;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      Release(this);
    }
  }
  this->fRef = rval->fRef;
  rval->fRef = (TPZReference *)0x0;
  return this;
}

Assistant:

TPZAutoPointer &operator=(TPZAutoPointer<T> &&rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = rval.fRef;
        rval.fRef = nullptr;
        return *this;
    }